

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PopStyleVar(int count)

{
  ImGuiStyleMod *pIVar1;
  ImGuiContext *pIVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  pIVar2 = GImGui;
  if (0 < count) {
    uVar3 = (GImGui->StyleModifiers).Size;
    iVar4 = count + 1;
    do {
      if ((int)uVar3 < 1) {
        __assert_fail("Size > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/imgui/imgui.h"
                      ,0x58d,"T &ImVector<ImGuiStyleMod>::back() [T = ImGuiStyleMod]");
      }
      pIVar1 = (pIVar2->StyleModifiers).Data;
      uVar6 = (ulong)(uint)pIVar1[(ulong)uVar3 - 1].VarIdx;
      if (0x16 < uVar6) {
        __assert_fail("idx >= 0 && idx < ImGuiStyleVar_COUNT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/imgui/imgui.cpp"
                      ,0x972,"const ImGuiStyleVarInfo *GetStyleVarInfo(ImGuiStyleVar)");
      }
      if (GStyleVarInfo[uVar6].Type == 8) {
        uVar5 = (ulong)GStyleVarInfo[uVar6].Offset;
        if (GStyleVarInfo[uVar6].Count == 1) {
          *(int *)((long)&(pIVar2->Style).Alpha + uVar5) =
               pIVar1[(ulong)uVar3 - 1].field_1.BackupInt[0];
        }
        else if (GStyleVarInfo[uVar6].Count == 2) {
          *(int *)((long)&(pIVar2->Style).Alpha + uVar5) =
               pIVar1[(ulong)uVar3 - 1].field_1.BackupInt[0];
          *(int *)((long)&(pIVar2->Style).WindowPadding.x + uVar5) =
               pIVar1[(ulong)uVar3 - 1].field_1.BackupInt[1];
        }
      }
      uVar3 = uVar3 - 1;
      (pIVar2->StyleModifiers).Size = uVar3;
      iVar4 = iVar4 + -1;
    } while (1 < iVar4);
  }
  return;
}

Assistant:

void ImGui::PopStyleVar(int count)
{
    ImGuiContext& g = *GImGui;
    while (count > 0)
    {
        // We avoid a generic memcpy(data, &backup.Backup.., GDataTypeSize[info->Type] * info->Count), the overhead in Debug is not worth it.
        ImGuiStyleMod& backup = g.StyleModifiers.back();
        const ImGuiStyleVarInfo* info = GetStyleVarInfo(backup.VarIdx);
        void* data = info->GetVarPtr(&g.Style);
        if (info->Type == ImGuiDataType_Float && info->Count == 1)      { ((float*)data)[0] = backup.BackupFloat[0]; }
        else if (info->Type == ImGuiDataType_Float && info->Count == 2) { ((float*)data)[0] = backup.BackupFloat[0]; ((float*)data)[1] = backup.BackupFloat[1]; }
        g.StyleModifiers.pop_back();
        count--;
    }
}